

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O3

uint64_t yactfr::internal::anon_unknown_0::readFlUIntBe13At6(uint8_t *buf)

{
  return (ulong)((*buf & 3) * 0x800 + (uint)buf[1] * 8 | (uint)(buf[2] >> 5));
}

Assistant:

std::uint64_t readFlUIntBe13At6(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 8;
    res |= buf[1];
    res <<= 3;
    res |= (buf[2] >> 5);
    res &= UINT64_C(0x1fff);
    return res;
}